

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O2

void __thiscall
datarate_test::(anonymous_namespace)::DatarateTestSVC_BasicRateTargetingSVC3TL3SLHDMultiRef_Test::
~DatarateTestSVC_BasicRateTargetingSVC3TL3SLHDMultiRef_Test
          (DatarateTestSVC_BasicRateTargetingSVC3TL3SLHDMultiRef_Test *this)

{
  anon_unknown_0::DatarateTestSVC_BasicRateTargetingSVC3TL3SLHDMultiRef_Test::
  ~DatarateTestSVC_BasicRateTargetingSVC3TL3SLHDMultiRef_Test
            ((DatarateTestSVC_BasicRateTargetingSVC3TL3SLHDMultiRef_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(DatarateTestSVC, BasicRateTargetingSVC3TL3SLHDMultiRef) {
  BasicRateTargetingSVC3TL3SLHDMultiRefTest();
}